

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_combo_begin_image_text(nk_context *ctx,char *selected,int len,nk_image img,nk_vec2 size)

{
  nk_command_buffer *out;
  nk_vec2 nVar1;
  nk_window *win;
  nk_rect r;
  nk_rect rect;
  nk_rect header;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  nk_widget_layout_states nVar5;
  int iVar6;
  long lVar7;
  nk_context *i;
  nk_style_combo *pnVar8;
  uint is_clicked;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar9;
  float fVar10;
  nk_rect r_00;
  nk_rect rect_00;
  nk_rect r_01;
  nk_rect b;
  nk_text text;
  nk_rect button;
  nk_rect local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  nk_text local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  nk_rect local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x60e1,
                  "int nk_combo_begin_image_text(struct nk_context *, const char *, int, struct nk_image, struct nk_vec2)"
                 );
  }
  win = ctx->current;
  if (win != (nk_window *)0x0) {
    local_68._8_4_ = in_XMM0_Dc;
    local_68._0_8_ = size;
    local_68._12_4_ = in_XMM0_Dd;
    if (win->layout != (nk_panel *)0x0) {
      nVar5 = nk_widget(&local_b8,ctx);
      if (nVar5 == NK_WIDGET_INVALID) {
        iVar6 = 0;
      }
      else {
        i = ctx;
        if ((win->layout->flags & 0x1000) != 0) {
          i = (nk_context *)0x0;
        }
        if (nVar5 == NK_WIDGET_ROM) {
          i = (nk_context *)0x0;
        }
        local_98._4_4_ = local_b8.y;
        local_98._0_4_ = local_b8.x;
        local_a8._4_4_ = local_b8.h;
        local_a8._0_4_ = local_b8.w;
        r.y = local_b8.y;
        r.x = local_b8.x;
        r.w = local_b8.w;
        r.h = local_b8.h;
        local_98._8_8_ = 0;
        local_a8._8_8_ = 0;
        iVar6 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
        auVar4 = local_98;
        auVar3 = local_a8;
        if ((ctx->last_widget_state & 0x20) == 0) {
          if ((ctx->last_widget_state & 0x10) == 0) {
            pnVar8 = &(ctx->style).combo;
            local_88.text = (ctx->style).combo.label_normal;
          }
          else {
            pnVar8 = (nk_style_combo *)&(ctx->style).combo.hover;
            local_88.text = (ctx->style).combo.label_hover;
          }
        }
        else {
          pnVar8 = (nk_style_combo *)&(ctx->style).combo.active;
          local_88.text = (ctx->style).combo.label_active;
        }
        uVar2 = local_a8._0_8_;
        is_clicked = CONCAT31(0,iVar6 != 0);
        local_98 = auVar4;
        if ((pnVar8->normal).type == NK_STYLE_ITEM_IMAGE) {
          local_88.background.r = '\0';
          local_88.background.g = '\0';
          local_88.background.b = '\0';
          local_88.background.a = '\0';
          r_00.w = (float)local_a8._0_4_;
          r_00.h = (float)local_a8._4_4_;
          r_00.x = (float)local_98._0_4_;
          r_00.y = (float)local_98._4_4_;
          local_a8 = auVar3;
          nk_draw_image(&win->buffer,r_00,&(pnVar8->normal).data.image,(nk_color)0xffffffff);
        }
        else {
          local_88.background = (pnVar8->normal).data.color;
          local_a8._0_4_ = is_clicked;
          auVar3 = local_a8;
          local_a8._0_4_ = (undefined4)uVar2;
          local_a8._4_4_ = SUB84(uVar2,4);
          rect_00.w = (float)local_a8._0_4_;
          rect_00.h = (float)local_a8._4_4_;
          rect_00.x = (float)local_98._0_4_;
          rect_00.y = (float)local_98._4_4_;
          local_a8 = auVar3;
          nk_fill_rect(&win->buffer,rect_00,(ctx->style).combo.rounding,local_88.background);
          rect.y = local_b8.y;
          rect.x = local_b8.x;
          rect.w = local_b8.w;
          rect.h = local_b8.h;
          is_clicked = local_a8._0_4_;
          nk_stroke_rect(&win->buffer,rect,(ctx->style).combo.rounding,(ctx->style).combo.border,
                         (ctx->style).combo.border_color);
        }
        lVar7 = 0x1be4;
        if ((ctx->last_widget_state & 0x10) == 0) {
          lVar7 = (ulong)(iVar6 != 0) * 8 + 0x1be0;
        }
        local_40.y = (ctx->style).combo.button_padding.y;
        local_40.w = local_b8.h - (local_40.y + local_40.y);
        local_40.x = ((local_b8.x + local_b8.w) - local_b8.h) - (ctx->style).combo.button_padding.x;
        local_a8 = ZEXT416((uint)local_40.x);
        local_40.y = local_40.y + local_b8.y;
        nVar1 = (ctx->style).combo.button.padding;
        fVar9 = nVar1.x;
        local_50.x = local_40.x + fVar9;
        fVar10 = nVar1.y;
        local_50.y = local_40.y + fVar10;
        local_50.w = local_40.w - (fVar9 + fVar9);
        local_50.h = local_40.w - (fVar10 + fVar10);
        out = &win->buffer;
        local_40.h = local_40.w;
        nk_draw_button_symbol
                  (out,&local_40,&local_50,ctx->last_widget_state,&(ctx->style).combo.button,
                   *(nk_symbol_type *)((long)&(ctx->input).keyboard.keys[0].down + lVar7),
                   (ctx->style).font);
        nVar1 = (ctx->style).combo.content_padding;
        fVar9 = local_b8.x + nVar1.x;
        fVar10 = nVar1.y;
        local_78 = CONCAT44(local_b8.y + fVar10,fVar9);
        uStack_70 = 0;
        r_01.w = local_b8.h - (fVar10 + fVar10);
        local_98 = ZEXT416((uint)r_01.w);
        r_01.y = local_b8.y + fVar10;
        r_01.x = fVar9;
        r_01.h = r_01.w;
        nk_draw_image(out,r_01,&img,(nk_color)0xffffffff);
        local_88.padding.x = 0.0;
        local_88.padding.y = 0.0;
        nVar1 = (ctx->style).combo.content_padding;
        fVar9 = nVar1.x;
        fVar10 = nVar1.y;
        b.x = (float)local_98._0_4_ + (float)local_78 + (ctx->style).combo.spacing.x + fVar9;
        b.y = local_b8.y + fVar10;
        b.w = ((float)local_a8._0_4_ - fVar9) - b.x;
        b.h = local_b8.h - (fVar10 + fVar10);
        nk_widget_text(out,b,selected,len,&local_88,0x11,(ctx->style).font);
        header.y = local_b8.y;
        header.x = local_b8.x;
        header.w = local_b8.w;
        header.h = local_b8.h;
        iVar6 = nk_combo_begin(ctx,win,(nk_vec2)local_68._0_8_,is_clicked,header);
      }
      return iVar6;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x60e3,
                  "int nk_combo_begin_image_text(struct nk_context *, const char *, int, struct nk_image, struct nk_vec2)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x60e2,
                "int nk_combo_begin_image_text(struct nk_context *, const char *, int, struct nk_image, struct nk_vec2)"
               );
}

Assistant:

NK_API int
nk_combo_begin_image_text(struct nk_context *ctx, const char *selected, int len,
    struct nk_image img, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_style *style;
    struct nk_input *in;

    struct nk_rect header;
    int is_clicked = nk_false;
    enum nk_widget_layout_states s;
    const struct nk_style_item *background;
    struct nk_text text;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (!s) return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->combo.active;
        text.text = style->combo.label_active;
    } else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
        background = &style->combo.hover;
        text.text = style->combo.label_hover;
    } else {
        background = &style->combo.normal;
        text.text = style->combo.label_normal;
    }
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        text.background = nk_rgba(0,0,0,0);
        nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
    } else {
        text.background = background->data.color;
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        struct nk_rect content;
        struct nk_rect button;
        struct nk_rect label;
        struct nk_rect image;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;
        nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);

        /* draw image */
        image.x = header.x + style->combo.content_padding.x;
        image.y = header.y + style->combo.content_padding.y;
        image.h = header.h - 2 * style->combo.content_padding.y;
        image.w = image.h;
        nk_draw_image(&win->buffer, image, &img, nk_white);

        /* draw label */
        text.padding = nk_vec2(0,0);
        label.x = image.x + image.w + style->combo.spacing.x + style->combo.content_padding.x;
        label.y = header.y + style->combo.content_padding.y;
        label.w = (button.x - style->combo.content_padding.x) - label.x;
        label.h = header.h - 2 * style->combo.content_padding.y;
        nk_widget_text(&win->buffer, label, selected, len, &text, NK_TEXT_LEFT, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}